

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesPartialsFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  ulong uVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  ulong uVar18;
  double dVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double m222;
  double m221;
  double m220;
  double m213;
  double m212;
  double m211;
  double m210;
  double m203;
  double m202;
  double m201;
  double m200;
  int w;
  int u;
  int l;
  undefined4 local_c4;
  double sum23;
  double sum22;
  double sum21;
  double sum20;
  double p23;
  double p22;
  double p21;
  double p20;
  double scaleFactor;
  int state1;
  int k;
  double m233;
  double m232;
  double m231;
  double m230;
  double m223;
  
  for (scaleFactor._4_4_ = 0; scaleFactor._4_4_ < *(int *)(in_RDI + 0x34);
      scaleFactor._4_4_ = scaleFactor._4_4_ + 1) {
    scaleFactor._0_4_ = scaleFactor._4_4_ * 4 * *(int *)(in_RDI + 0x18);
    if (m220._0_4_ != 0) {
      scaleFactor._0_4_ = m220._0_4_ * 4 + scaleFactor._0_4_;
    }
    iVar23 = scaleFactor._4_4_ * 0x14;
    uVar1 = *(ulong *)(in_R9 + (long)iVar23 * 8);
    dVar2 = *(double *)(in_R9 + (long)(iVar23 + 1) * 8);
    uVar3 = *(ulong *)(in_R9 + (long)(iVar23 + 2) * 8);
    uVar4 = *(ulong *)(in_R9 + (long)(iVar23 + 3) * 8);
    uVar5 = *(ulong *)(in_R9 + (long)(iVar23 + 5) * 8);
    dVar6 = *(double *)(in_R9 + (long)(iVar23 + 6) * 8);
    uVar7 = *(ulong *)(in_R9 + (long)(iVar23 + 7) * 8);
    uVar8 = *(ulong *)(in_R9 + (long)(iVar23 + 8) * 8);
    uVar9 = *(ulong *)(in_R9 + (long)(iVar23 + 10) * 8);
    dVar10 = *(double *)(in_R9 + (long)(iVar23 + 0xb) * 8);
    uVar11 = *(ulong *)(in_R9 + (long)(iVar23 + 0xc) * 8);
    uVar12 = *(ulong *)(in_R9 + (long)(iVar23 + 0xd) * 8);
    uVar13 = *(ulong *)(in_R9 + (long)(iVar23 + 0xf) * 8);
    dVar14 = *(double *)(in_R9 + (long)(iVar23 + 0x10) * 8);
    uVar15 = *(ulong *)(in_R9 + (long)(iVar23 + 0x11) * 8);
    uVar16 = *(ulong *)(in_R9 + (long)(iVar23 + 0x12) * 8);
    for (local_c4 = m220._0_4_; local_c4 < m213._0_4_; local_c4 = local_c4 + 1) {
      iVar22 = *(int *)(in_RDX + (long)local_c4 * 4);
      dVar17 = *(double *)((long)m221 + (long)local_c4 * 8);
      uVar18 = *(ulong *)(in_R8 + (long)scaleFactor._0_4_ * 8);
      dVar19 = *(double *)(in_R8 + (long)(scaleFactor._0_4_ + 1) * 8);
      uVar20 = *(ulong *)(in_R8 + (long)(scaleFactor._0_4_ + 2) * 8);
      uVar21 = *(ulong *)(in_R8 + (long)(scaleFactor._0_4_ + 3) * 8);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar1;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar18;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar2 * dVar19;
      auVar24 = vfmadd213sd_fma(auVar36,auVar24,auVar44);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar3;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar20;
      auVar24 = vfmadd213sd_fma(auVar45,auVar25,auVar24);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar4;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar21;
      auVar24 = vfmadd213sd_fma(auVar26,auVar37,auVar24);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar5;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar18;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar6 * dVar19;
      auVar25 = vfmadd213sd_fma(auVar38,auVar27,auVar46);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar7;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar20;
      auVar25 = vfmadd213sd_fma(auVar47,auVar28,auVar25);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar8;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar21;
      auVar25 = vfmadd213sd_fma(auVar29,auVar39,auVar25);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar9;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar18;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar10 * dVar19;
      auVar26 = vfmadd213sd_fma(auVar40,auVar30,auVar48);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar11;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar20;
      auVar26 = vfmadd213sd_fma(auVar49,auVar31,auVar26);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar12;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar21;
      auVar26 = vfmadd213sd_fma(auVar32,auVar41,auVar26);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar13;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar18;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar14 * dVar19;
      auVar27 = vfmadd213sd_fma(auVar42,auVar33,auVar50);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar15;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar20;
      auVar27 = vfmadd213sd_fma(auVar51,auVar34,auVar27);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar16;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar21;
      auVar27 = vfmadd213sd_fma(auVar35,auVar43,auVar27);
      *(double *)(in_RSI + (long)scaleFactor._0_4_ * 8) =
           (*(double *)(in_RCX + (long)(iVar23 + iVar22) * 8) * auVar24._0_8_) / dVar17;
      *(double *)(in_RSI + (long)(scaleFactor._0_4_ + 1) * 8) =
           (*(double *)(in_RCX + (long)(iVar23 + 5 + iVar22) * 8) * auVar25._0_8_) / dVar17;
      *(double *)(in_RSI + (long)(scaleFactor._0_4_ + 2) * 8) =
           (*(double *)(in_RCX + (long)(iVar23 + 10 + iVar22) * 8) * auVar26._0_8_) / dVar17;
      *(double *)(in_RSI + (long)(scaleFactor._0_4_ + 3) * 8) =
           (*(double *)(in_RCX + (long)(iVar23 + 0xf + iVar22) * 8) * auVar27._0_8_) / dVar17;
      scaleFactor._0_4_ = scaleFactor._0_4_ + 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesPartialsFixedScaling(REALTYPE* destP,
                                                                             const int* states1,
                                                                             const REALTYPE* matrices1,
                                                                             const REALTYPE* partials2,
                                                                             const REALTYPE* matrices2,
                                                                             const REALTYPE* scaleFactors,
                                                                             int startPattern,
                                                                             int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const REALTYPE scaleFactor = scaleFactors[k];

            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            destP[u    ] = matrices1[w            + state1] * sum20 / scaleFactor;
            destP[u + 1] = matrices1[w + OFFSET*1 + state1] * sum21 / scaleFactor;
            destP[u + 2] = matrices1[w + OFFSET*2 + state1] * sum22 / scaleFactor;
            destP[u + 3] = matrices1[w + OFFSET*3 + state1] * sum23 / scaleFactor;

            u += 4;
        }
    }
}